

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::LastChildElement(XMLNode *this,char *name)

{
  bool bVar1;
  XMLElement *pXVar2;
  char *p;
  char *in_RSI;
  long in_RDI;
  XMLElement *element;
  XMLNode *node;
  long *local_20;
  
  local_20 = *(long **)(in_RDI + 0x38);
  do {
    if (local_20 == (long *)0x0) {
      return (XMLElement *)0x0;
    }
    pXVar2 = (XMLElement *)(**(code **)(*local_20 + 0x30))();
    if (pXVar2 != (XMLElement *)0x0) {
      if (in_RSI == (char *)0x0) {
        return pXVar2;
      }
      p = XMLElement::Name((XMLElement *)0x2c2ddb);
      bVar1 = XMLUtil::StringEqual(p,in_RSI,0x7fffffff);
      if (bVar1) {
        return pXVar2;
      }
    }
    local_20 = (long *)local_20[8];
  } while( true );
}

Assistant:

const XMLElement* XMLNode::LastChildElement( const char* name ) const
{
    for( const XMLNode* node = _lastChild; node; node = node->_prev ) {
        const XMLElement* element = node->ToElement();
        if ( element ) {
            if ( !name || XMLUtil::StringEqual( element->Name(), name ) ) {
                return element;
            }
        }
    }
    return 0;
}